

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_spy_ImportEnumerator.cpp
# Opt level: O1

bool __thiscall axl::spy::ImportIterator::readRel(ImportIterator *this)

{
  Elf64_Sym *pEVar1;
  ElfImportEnumeration *pEVar2;
  ulong uVar3;
  ulong uVar4;
  ElfRel *pEVar5;
  int iVar6;
  size_t sVar7;
  ulong uVar8;
  ElfRel *pEVar9;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> SStack_38;
  
  do {
    pEVar2 = (this->m_enumeration).m_p;
    uVar3 = this->m_index;
    uVar4 = pEVar2->m_pltRelCount;
    if (uVar3 < uVar4) {
      pEVar5 = pEVar2->m_pltRelTable + uVar4;
      pEVar9 = pEVar2->m_pltRelTable + uVar3;
      iVar6 = 7;
    }
    else {
      pEVar5 = pEVar2->m_gotRelTable + pEVar2->m_gotRelCount;
      pEVar9 = pEVar2->m_gotRelTable + (uVar3 - uVar4);
      iVar6 = 6;
    }
    if (pEVar9 < pEVar5) {
      sVar7 = this->m_index;
      do {
        sVar7 = sVar7 + 1;
        if ((int)pEVar9->r_info == iVar6) {
          uVar8 = pEVar9->r_info >> 0x20;
          if (((pEVar2->m_symbolTable[uVar8].st_info & 0xf) == 2) &&
             (pEVar1 = pEVar2->m_symbolTable + uVar8,
             (ulong)pEVar1->st_name < pEVar2->m_stringTableSize)) {
            sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
                      (&SStack_38,pEVar2->m_stringTable + pEVar1->st_name);
            sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::move
                      ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)this,&SStack_38);
            sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&SStack_38);
            (this->super_ImportIteratorBase).m_slot =
                 (void **)(pEVar9->r_offset + ((this->m_enumeration).m_p)->m_baseAddress);
            return true;
          }
        }
        pEVar9 = pEVar9 + 1;
        this->m_index = sVar7;
      } while (pEVar9 < pEVar5);
    }
    if (uVar4 <= uVar3) {
      ImportIteratorBase::reset(&this->super_ImportIteratorBase);
      return false;
    }
  } while( true );
}

Assistant:

bool
ImportIterator::readRel() {
	ASSERT(m_enumeration && "attempt to read ElfRel from a null-iterator");

	int relType;
	ElfRel* rel;
	ElfRel* end;

	if (m_index < m_enumeration->m_pltRelCount) {
		relType = R_JUMP_SLOT;
		rel = m_enumeration->m_pltRelTable;
		end = rel + m_enumeration->m_pltRelCount;
		rel += m_index;
	} else {
		relType = R_GLOB_DAT;
		rel = m_enumeration->m_gotRelTable;
		end = rel + m_enumeration->m_gotRelCount;
		rel += m_index - m_enumeration->m_pltRelCount;
	}

	for (; rel < end; rel++, m_index++) {
		if (ELF_R_TYPE(rel->r_info) != relType)
			continue;

		size_t symIdx = ELF_R_SYM(rel->r_info);
		ElfW(Sym)* sym = m_enumeration->m_symbolTable + symIdx;
		if (ELF_ST_TYPE(sym->st_info) != STT_FUNC)
			continue;

		if (sym->st_name >= m_enumeration->m_stringTableSize) {
			AXL_TRACE("WARNING: ImportIterator::readRel: symbol out of string table\n");
			continue;
		}

		m_symbolName = m_enumeration->m_stringTable + sym->st_name;
		m_slot = (void**)(m_enumeration->m_baseAddress + rel->r_offset);
		return true;
	}

	if (relType == R_JUMP_SLOT)
		return readRel(); // retry with GOT

	reset();
	return false;
}